

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

bool testExtendAndPrepend<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  ostream *poVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  string prepend;
  string extend;
  string base;
  string input;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  char *local_4c8;
  ulong local_4c0;
  char local_4b8 [16];
  char *local_4a8;
  ulong local_4a0;
  char local_498 [16];
  char *local_488;
  ulong local_480;
  char local_478 [16];
  byte *local_468;
  long local_460;
  byte local_458 [16];
  CyclicHash<unsigned_int,_unsigned_char> local_448;
  
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&local_448,4,L);
  local_468 = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"XABCDY","");
  local_488 = local_478;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_488,local_468 + 1,local_468 + local_460 + -1);
  if (local_480 != 4) {
    __assert_fail("base.size() == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                  ,0x11,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
  }
  local_4a8 = local_498;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_4a8,local_468 + 1,local_468 + local_460);
  local_4c8 = local_4b8;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_4c8,local_468,local_468 + local_460 + -1);
  if (local_480 != 0) {
    uVar6 = 0;
    do {
      local_448.hashvalue =
           (local_448.hashvalue >> ((char)local_448.wordsize - 1U & 0x1f) |
           (local_448.mask1 & local_448.hashvalue) * 2) ^
           local_448.hasher.hashvalues[(byte)local_488[uVar6]];
      uVar6 = uVar6 + 1;
    } while (local_480 != uVar6);
  }
  if (local_480 == 0) {
    uVar3 = 0;
  }
  else {
    uVar6 = 0;
    uVar3 = 0;
    do {
      uVar3 = (uVar3 >> ((char)local_448.wordsize - 1U & 0x1f) | (uVar3 & local_448.mask1) * 2) ^
              local_448.hasher.hashvalues[(uint)(int)local_488[uVar6]];
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) < local_480);
  }
  if (local_448.hashvalue == uVar3) {
    uVar3 = local_448.hasher.hashvalues[*local_468];
    uVar3 = (uVar3 >> ((char)local_448.wordsize - (byte)local_448.myr & 0x1f) |
            (local_448.maskn & uVar3) << ((byte)local_448.myr & 0x1f)) ^ local_448.hashvalue;
    if (local_4c0 == 0) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      uVar5 = 0;
      do {
        uVar5 = (uVar5 >> ((char)local_448.wordsize - 1U & 0x1f) | (uVar5 & local_448.mask1) * 2) ^
                local_448.hasher.hashvalues[(uint)(int)local_4c8[uVar6]];
        uVar6 = uVar6 + 1;
      } while ((uVar6 & 0xffffffff) < local_4c0);
    }
    if (uVar3 == uVar5) {
      bVar2 = (char)local_448.wordsize - 1;
      uVar5 = (local_448.hashvalue >> (bVar2 & 0x1f) | (local_448.mask1 & local_448.hashvalue) * 2)
              ^ local_448.hasher.hashvalues[local_468[local_460 + -1]];
      if (local_4a0 == 0) {
        uVar7 = 0;
      }
      else {
        uVar6 = 0;
        uVar7 = 0;
        do {
          uVar7 = (uVar7 >> (bVar2 & 0x1f) | (uVar7 & local_448.mask1) * 2) ^
                  local_448.hasher.hashvalues[(uint)(int)local_4a8[uVar6]];
          uVar6 = uVar6 + 1;
        } while ((uVar6 & 0xffffffff) < local_4a0);
      }
      if (uVar5 == uVar7) {
        if (local_480 == 0) {
          uVar7 = 0;
        }
        else {
          uVar6 = 0;
          uVar7 = 0;
          do {
            uVar7 = (uVar7 >> (bVar2 & 0x1f) | (uVar7 & local_448.mask1) * 2) ^
                    local_448.hasher.hashvalues[(uint)(int)local_488[uVar6]];
            uVar6 = uVar6 + 1;
          } while ((uVar6 & 0xffffffff) < local_480);
        }
        if (local_448.hashvalue != uVar7) {
          __assert_fail("hf.hashvalue == hf.hash(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2a,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        if (local_4c0 == 0) {
          uVar7 = 0;
        }
        else {
          uVar6 = 0;
          uVar7 = 0;
          do {
            uVar7 = (uVar7 >> (bVar2 & 0x1f) | (uVar7 & local_448.mask1) * 2) ^
                    local_448.hasher.hashvalues[(uint)(int)local_4c8[uVar6]];
            uVar6 = uVar6 + 1;
          } while ((uVar6 & 0xffffffff) < local_4c0);
        }
        if (uVar3 != uVar7) {
          __assert_fail("hf.hash_prepend(input[0]) == hf.hash(prepend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2b,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        if (local_4a0 == 0) {
          uVar3 = 0;
        }
        else {
          uVar6 = 0;
          uVar3 = 0;
          do {
            uVar3 = (uVar3 >> (bVar2 & 0x1f) | (uVar3 & local_448.mask1) * 2) ^
                    local_448.hasher.hashvalues[(uint)(int)local_4a8[uVar6]];
            uVar6 = uVar6 + 1;
          } while ((uVar6 & 0xffffffff) < local_4a0);
        }
        bVar4 = true;
        if (uVar5 != uVar3) {
          __assert_fail("hf.hash_extend(input.back()) == hf.hash(extend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2c,"bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<>]");
        }
        goto LAB_001045ed;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4a8,local_4a0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      if (local_4a0 != 0) {
        uVar3 = 0;
        do {
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_4a0);
      }
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4c8,local_4c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      if (local_4c0 != 0) {
        uVar3 = 0;
        do {
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_4c0);
      }
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_488,local_480);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (local_480 != 0) {
      uVar3 = 0;
      do {
        uVar3 = uVar3 + 1;
      } while (uVar3 < local_480);
    }
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  bVar4 = false;
LAB_001045ed:
  if (local_4c8 != local_4b8) {
    operator_delete(local_4c8);
  }
  if (local_4a8 != local_498) {
    operator_delete(local_4a8);
  }
  if (local_488 != local_478) {
    operator_delete(local_488);
  }
  if (local_468 != local_458) {
    operator_delete(local_468);
  }
  return bVar4;
}

Assistant:

bool testExtendAndPrepend(uint L = 19) {
  const uint n(4); // n-grams
  hashfunction hf(n, L);
  string input = "XABCDY";
  string base(input.begin() + 1, input.end() - 1);
  assert(base.size() == n);
  string extend(input.begin() + 1, input.end());
  string prepend(input.begin(), input.end() - 1);

  for (string::const_iterator j = base.begin(); j != base.end(); ++j) {
    hf.eat(*j);
  }
  if (hf.hashvalue != hf.hash(base)) {
    std::cout << "bug!" << std::endl;
    std::cout << base << " " << hf.hash(base) << std::endl;
    return false;
  }
  if (hf.hash_prepend(input[0]) != hf.hash(prepend)) {
    std::cout << "bug!" << std::endl;
    std::cout << prepend << " " << hf.hash_prepend(input[0]) << " "
              << hf.hash(prepend) << std::endl;
    return false;
  }
  if (hf.hash_extend(input.back()) != hf.hash(extend)) {
    std::cout << "bug!" << std::endl;
    std::cout << extend << " " << hf.hash_extend(input.back()) << " "
              << hf.hash(extend) << std::endl;
    return false;
  }

  assert(hf.hashvalue == hf.hash(base));
  assert(hf.hash_prepend(input[0]) == hf.hash(prepend));
  assert(hf.hash_extend(input.back()) == hf.hash(extend));

  return true;
}